

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_conversions.h
# Opt level: O0

conversion_result mjs::unicode::utf8_to_utf32<char>(char *src,uint max_length)

{
  byte first_code_point;
  uint uVar1;
  conversion_result cVar2;
  uint local_2c;
  uint uStack_28;
  uint8_t here;
  uint i;
  char32_t code_point;
  uint l;
  uint8_t first_code_unit;
  uint max_length_local;
  char *src_local;
  
  if (max_length == 0) {
    __assert_fail("max_length != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/char_conversions.h"
                  ,0x24,
                  "conversion_result mjs::unicode::utf8_to_utf32(const CharT *, unsigned int) [CharT = char]"
                 );
  }
  first_code_point = *src;
  uVar1 = utf8_length_from_lead_code_unit(first_code_point);
  if (uVar1 == 0) {
    src_local = (char *)0x0;
  }
  else if (max_length < uVar1) {
    src_local = (char *)0x0;
  }
  else if (uVar1 == 1) {
    src_local = (char *)(ulong)CONCAT14(first_code_point,1);
  }
  else {
    uStack_28 = (uint)first_code_point & 0xfc >> ((byte)uVar1 & 0x1f);
    for (local_2c = 1; local_2c < uVar1; local_2c = local_2c + 1) {
      if ((src[local_2c] & 0xc0U) != 0x80) {
        cVar2.length = 0;
        cVar2.code_point = L'\0';
        return cVar2;
      }
      uStack_28 = (byte)src[local_2c] & 0x3f | uStack_28 << 6;
    }
    src_local = (char *)CONCAT44(uStack_28,uVar1);
  }
  return (conversion_result)src_local;
}

Assistant:

constexpr conversion_result utf8_to_utf32(const CharT* src, unsigned max_length) {
    static_assert(sizeof(CharT) == 1);
    assert(max_length != 0);
    const auto first_code_unit = static_cast<uint8_t>(src[0]);
    const auto l = utf8_length_from_lead_code_unit(first_code_unit);
    if (!l) {
        // Invalid leading byte
        return invalid_conversion;
    } else if (l > max_length) {
        // Not enough source characters
        return invalid_conversion;
    } else if (l == 1) {
        // Simple case
        return { 1, first_code_unit };
    }
    char32_t code_point = first_code_unit & (0b1111'1100 >> l);
    for (unsigned i = 1; i < l; ++i) {
        const auto here = static_cast<uint8_t>(src[i]);
        if ((here & 0b1100'0000) != 0b1000'0000) {
            // Invalid continuation byte
            return invalid_conversion;
        }
        code_point <<= 6;
        code_point |= here & 0x3f;
    }
    
    return { l, code_point };
}